

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::GmmXe_LPGCachePolicy::SetupPAT(GmmXe_LPGCachePolicy *this)

{
  Context *pCVar1;
  ulong uVar2;
  
  pCVar1 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  if ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters
      != 0) {
    uVar2 = 0;
    do {
      pCVar1->PrivatePATTable[uVar2].Value = 0xc;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                     super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                     super_GmmCachePolicyCommon.NumPATRegisters);
  }
  pCVar1->PrivatePATTable[0] = (GMM_PRIVATE_PAT)0x0;
  pCVar1->PrivatePATTable[1] = (GMM_PRIVATE_PAT)0x4;
  pCVar1->PrivatePATTable[2] = (GMM_PRIVATE_PAT)0xc;
  pCVar1->PrivatePATTable[3] = (GMM_PRIVATE_PAT)0x2;
  pCVar1->PrivatePATTable[4].Value = 3;
  *(undefined4 *)&(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.field_0x2c = 4;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmXe_LPGCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define GMM_DEFINE_PAT_ELEMENT(indx, L4Caching, Coh)       \
    {                                                      \
        pPATTlbElement[indx].Xe_LPG.Coherency = Coh;       \
        pPATTlbElement[indx].Xe_LPG.L4CC      = L4Caching; \
        pPATTlbElement[indx].Xe_LPG.Reserved  = 0;         \
    }

    // clang-format off

    // Default PAT Table
    for (uint32_t i = 0; i < NumPATRegisters; i++)
    {   //                      Index      CachingPolicy       Coherency
        GMM_DEFINE_PAT_ELEMENT( i,          L4_UC              , 0 );
    }

    // Fixed PAT Table
    //                      Index   CachingPolicy   Coherency
    GMM_DEFINE_PAT_ELEMENT( 0      , L4_WB              , 0)    // PATRegValue = 0x0
    GMM_DEFINE_PAT_ELEMENT( 1      , L4_WT              , 0)    // PATRegValue = 0x4
    GMM_DEFINE_PAT_ELEMENT( 2      , L4_UC              , 0)    // PATRegValue = 0xC
    GMM_DEFINE_PAT_ELEMENT( 3      , L4_WB              , 2)    // PATRegValue = 0x2
    GMM_DEFINE_PAT_ELEMENT( 4      , L4_WB              , 3)    // PATRegValue = 0x3

    CurrentMaxPATIndex = 4;

// clang-format on
#undef GMM_DEFINE_PAT
#undef L4_WB
#undef L4_WT
#undef L4_UC
    return GMM_SUCCESS;
}